

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HdmiCecAnalyzerResults.cpp
# Opt level: O1

void __thiscall
HdmiCecAnalyzerResults::GenerateTransactionTabularText
          (HdmiCecAnalyzerResults *this,U64 param_1,DisplayBase param_2)

{
  char *local_38 [2];
  char local_28 [16];
  
  AnalyzerResults::ClearResultStrings();
  local_38[0] = local_28;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_38,"Not supported","");
  AnalyzerResults::AddResultString
            ((char *)this,local_38[0],(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0);
  if (local_38[0] != local_28) {
    operator_delete(local_38[0]);
  }
  return;
}

Assistant:

void HdmiCecAnalyzerResults::GenerateTransactionTabularText( U64 /*transaction_id*/, DisplayBase /*display_base*/ )
{
    ClearResultStrings();
    AddResult( "Not supported" );
}